

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O2

void P_SerializePlayers(FArchive *arc,bool skipload)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  char **ppcVar4;
  char *pcVar5;
  player_t *ppVar6;
  char **str;
  ulong uVar7;
  FPlayerStart *mthing;
  long *plVar8;
  ulong *puVar9;
  undefined7 in_register_00000031;
  bool bVar10;
  ulong uVar11;
  int i;
  byte bVar12;
  undefined1 *puVar13;
  BYTE numPlayers;
  char *name;
  byte local_302;
  byte local_301;
  void *local_300;
  ulong local_2f8;
  undefined4 local_2ec;
  player_t *local_2e8;
  ulong *local_2e0;
  char **local_2d8;
  player_t local_2d0;
  
  local_2ec = (undefined4)CONCAT71(in_register_00000031,skipload);
  bVar12 = 0;
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    bVar12 = bVar12 + playeringame[lVar2];
  }
  local_302 = bVar12;
  if (arc->m_Storing == true) {
    FArchive::operator<<(arc,&local_302);
    ppVar6 = (player_t *)&players;
    for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
      if (playeringame[lVar2] == true) {
        pcVar3 = userinfo_t::GetName(&ppVar6->userinfo);
        FArchive::WriteString(arc,pcVar3);
        player_t::Serialize(ppVar6,arc);
      }
      ppVar6 = ppVar6 + 1;
    }
    return;
  }
  FArchive::operator<<(arc,&local_301);
  uVar11 = (ulong)local_301;
  if (uVar11 == 1) {
    local_2d8 = (char **)0x0;
    FArchive::operator<<(arc,(char **)&local_2d8);
    ppVar6 = (player_t *)&players;
    bVar10 = false;
    for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
      if (playeringame[lVar2] == true) {
        if (bVar10) {
          bVar10 = true;
          if (ppVar6->mo != (APlayerPawn *)0x0) {
            (*(ppVar6->mo->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])();
            ppVar6->mo = (APlayerPawn *)0x0;
          }
        }
        else {
          player_t::player_t(&local_2d0);
          player_t::Serialize(&local_2d0,arc);
          if ((char)local_2ec == '\0') {
            CopyPlayer(ppVar6,&local_2d0,(char *)local_2d8);
          }
          player_t::~player_t(&local_2d0);
          bVar10 = true;
        }
      }
      ppVar6 = ppVar6 + 1;
    }
    ppcVar4 = local_2d8;
    if (local_2d8 == (char **)0x0) goto LAB_004c96b2;
  }
  else {
    ppcVar4 = (char **)operator_new__((ulong)((uint)local_301 * 8));
    local_300 = (void *)(uVar11 * 0x2a0 | 8);
    local_2e0 = (ulong *)operator_new__((ulong)local_300);
    *local_2e0 = uVar11;
    ppVar6 = (player_t *)(local_2e0 + 1);
    local_2f8 = uVar11;
    local_2e8 = ppVar6;
    if (uVar11 != 0) {
      lVar2 = 0;
      do {
        player_t::player_t(ppVar6);
        lVar2 = lVar2 + -0x2a0;
        ppVar6 = ppVar6 + 1;
      } while (uVar11 * -0x2a0 - lVar2 != 0);
    }
    local_300 = operator_new__(local_2f8);
    str = ppcVar4;
    ppVar6 = local_2e8;
    for (uVar11 = 0; local_2f8 != uVar11; uVar11 = uVar11 + 1) {
      *str = (char *)0x0;
      FArchive::operator<<(arc,str);
      player_t::Serialize(ppVar6,arc);
      *(undefined1 *)((long)local_300 + uVar11) = 0;
      ppVar6 = ppVar6 + 1;
      str = str + 1;
    }
    for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
      *(byte *)((long)&local_2d0.mo + lVar2) = (playeringame[lVar2] ^ 1U) * '\x02';
    }
    puVar9 = local_2e0;
    if ((char)local_2ec == '\0') {
      for (uVar11 = 0; uVar11 != local_2f8; uVar11 = uVar11 + 1) {
        ppVar6 = (player_t *)&players;
        for (uVar7 = 0; uVar7 != 8; uVar7 = uVar7 + 1) {
          if (*(char *)((long)&local_2d0.mo + uVar7) == '\0') {
            pcVar5 = userinfo_t::GetName(&ppVar6->userinfo);
            pcVar3 = ppcVar4[uVar11];
            iVar1 = strcasecmp(pcVar5,pcVar3);
            if (iVar1 == 0) {
              Printf("Found player %d (%s) at %d\n",uVar11 & 0xffffffff,pcVar3,uVar7 & 0xffffffff);
              CopyPlayer(ppVar6,local_2e8 + uVar11,ppcVar4[uVar11]);
              *(undefined1 *)((long)&local_2d0.mo + uVar7) = 1;
              *(undefined1 *)((long)local_300 + uVar11) = 1;
              break;
            }
          }
          ppVar6 = ppVar6 + 1;
        }
      }
      for (uVar11 = 0; puVar9 = local_2e0, uVar11 != local_2f8; uVar11 = uVar11 + 1) {
        if (*(char *)((long)local_300 + uVar11) == '\0') {
          ppVar6 = (player_t *)&players;
          for (uVar7 = 0; uVar7 != 8; uVar7 = uVar7 + 1) {
            if (*(char *)((long)&local_2d0.mo + uVar7) == '\0') {
              pcVar3 = ppcVar4[uVar11];
              pcVar5 = userinfo_t::GetName(&ppVar6->userinfo);
              Printf("Assigned player %d (%s) to %d (%s)\n",uVar11 & 0xffffffff,pcVar3,
                     uVar7 & 0xffffffff,pcVar5);
              CopyPlayer(ppVar6,local_2e8 + uVar11,ppcVar4[uVar11]);
              *(undefined1 *)((long)&local_2d0.mo + uVar7) = 1;
              *(undefined1 *)((long)local_300 + uVar11) = 1;
              break;
            }
            ppVar6 = ppVar6 + 1;
          }
        }
      }
      plVar8 = &players;
      for (lVar2 = 0; uVar11 = local_2f8, lVar2 != 8; lVar2 = lVar2 + 1) {
        if ((*(char *)((long)&local_2d0.mo + lVar2) == '\0') && ((long *)*plVar8 != (long *)0x0)) {
          (**(code **)(*(long *)*plVar8 + 0x20))();
          *plVar8 = 0;
        }
        plVar8 = plVar8 + 0x54;
      }
      for (uVar7 = 0; ppVar6 = local_2e8, uVar11 != uVar7; uVar7 = uVar7 + 1) {
        if (*(char *)((long)local_300 + uVar7) == '\0') {
          (*(local_2e8->mo->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])();
          ppVar6->mo = (APlayerPawn *)0x0;
        }
        local_2e8 = local_2e8 + 1;
      }
    }
    operator_delete__(local_300);
    lVar2 = *puVar9 * 0x2a0;
    uVar11 = lVar2 + 8;
    uVar7 = *puVar9;
    while (uVar7 != 0) {
      player_t::~player_t((player_t *)((long)puVar9 + lVar2 + -0x298));
      lVar2 = lVar2 + -0x2a0;
      uVar7 = lVar2;
    }
    operator_delete__(puVar9,uVar11);
    uVar11 = local_2f8;
    for (uVar7 = 0; uVar11 != uVar7; uVar7 = uVar7 + 1) {
      if (ppcVar4[uVar7] != (char *)0x0) {
        operator_delete__(ppcVar4[uVar7]);
      }
    }
  }
  operator_delete__(ppcVar4);
LAB_004c96b2:
  if ((((char)local_2ec == '\0') && (local_301 < bVar12)) && (deathmatch.Value == 0)) {
    puVar13 = &DAT_009ba428;
    mthing = playerstarts;
    for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
      if ((playeringame[lVar2] == true) && (*(long *)(puVar13 + -8) == 0)) {
        *puVar13 = 3;
        P_SpawnPlayer(mthing,(int)lVar2,level.flags2 >> 6 & 2);
      }
      mthing = mthing + 1;
      puVar13 = puVar13 + 0x2a0;
    }
  }
  player_t::SendPitchLimits((player_t *)(&players + (long)consoleplayer * 0x54));
  return;
}

Assistant:

void P_SerializePlayers (FArchive &arc, bool skipload)
{
	BYTE numPlayers, numPlayersNow;
	int i;

	// Count the number of players present right now.
	for (numPlayersNow = 0, i = 0; i < MAXPLAYERS; ++i)
	{
		if (playeringame[i])
		{
			++numPlayersNow;
		}
	}

	if (arc.IsStoring())
	{
		// Record the number of players in this save.
		arc << numPlayersNow;

		// Record each player's name, followed by their data.
		for (i = 0; i < MAXPLAYERS; ++i)
		{
			if (playeringame[i])
			{
				arc.WriteString (players[i].userinfo.GetName());
				players[i].Serialize (arc);
			}
		}
	}
	else
	{
		arc << numPlayers;

		// If there is only one player in the game, they go to the
		// first player present, no matter what their name.
		if (numPlayers == 1)
		{
			ReadOnePlayer (arc, skipload);
		}
		else
		{
			ReadMultiplePlayers (arc, numPlayers, numPlayersNow, skipload);
		}
		if (!skipload && numPlayersNow > numPlayers)
		{
			SpawnExtraPlayers ();
		}
		// Redo pitch limits, since the spawned player has them at 0.
		players[consoleplayer].SendPitchLimits();
	}
}